

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O3

void pbrt::detail::stringPrintfRecursive<pbrt::WrapMode_const&,pbrt::ColorEncodingHandle_const&>
               (string *s,char *fmt,WrapMode *v,ColorEncodingHandle *args)

{
  long *plVar1;
  _Alloc_hider _Var2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char *s_00;
  ColorEncodingHandle *v_00;
  char cVar7;
  string str;
  size_type __dnew;
  string nextFmt;
  stringstream ss;
  long **local_228;
  long *local_220;
  long *local_218 [2];
  ColorEncodingHandle *local_208;
  long *local_200 [2];
  long local_1f0 [2];
  string local_1e0;
  char *local_1c0;
  ostream *local_1b8;
  undefined8 local_1b0;
  ostream local_1a8;
  undefined7 uStack_1a7;
  ios_base local_138 [264];
  
  local_1c0 = fmt;
  copyToFormatString(&local_1e0,&local_1c0,s);
  cVar7 = (char)&local_1e0;
  lVar4 = std::__cxx11::string::find(cVar7,0x2a);
  lVar5 = std::__cxx11::string::find(cVar7,0x73);
  lVar6 = std::__cxx11::string::find(cVar7,100);
  _Var2._M_p = local_1e0._M_dataplus._M_p;
  if (lVar4 != -1) {
    s_00 = "Non-integral type provided for %* format.";
    iVar3 = 0xe8;
LAB_00333290:
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print.h"
             ,iVar3,s_00);
  }
  if (lVar6 != -1) {
    s_00 = "Non-integral type passed to %d format.";
    iVar3 = 0x104;
    goto LAB_00333290;
  }
  local_208 = args;
  if (lVar5 == -1) {
    if (local_1e0._M_string_length == 0) {
      s_00 = "Excess values passed to Printf.";
      iVar3 = 0x10d;
      goto LAB_00333290;
    }
    iVar3 = snprintf((char *)0x0,0,local_1e0._M_dataplus._M_p,(ulong)*v);
    local_1b0 = 0;
    local_1a8 = (ostream)0x0;
    local_1b8 = &local_1a8;
    std::__cxx11::string::resize((ulong)&local_1b8,(char)(iVar3 + 1));
    snprintf((char *)local_1b8,(long)(iVar3 + 1),_Var2._M_p,(ulong)*v);
    std::__cxx11::string::pop_back();
    std::__cxx11::string::_M_append((char *)s,(ulong)local_1b8);
    v_00 = local_208;
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8,CONCAT71(uStack_1a7,local_1a8) + 1);
      v_00 = local_208;
    }
    goto LAB_0033322b;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  switch(*v) {
  case Repeat:
    local_228 = local_218;
    local_220 = (long *)0x6;
    local_218[0] = (long *)CONCAT17(local_218[0]._7_1_,0x746165706572);
    break;
  case Black:
    local_218[0]._0_6_ = 0x6b63616c62;
    goto LAB_00333125;
  case Clamp:
    local_218[0]._0_6_ = 0x706d616c63;
LAB_00333125:
    local_228 = local_218;
    local_220 = (long *)&DAT_00000005;
    break;
  case OctahedralSphere:
    local_228 = local_218;
    local_200[0] = (long *)0x10;
    local_228 = (long **)std::__cxx11::string::_M_create((ulong *)&local_228,(ulong)local_200);
    local_218[0] = local_200[0];
    *local_228 = (long *)0x726465686174636f;
    local_228[1] = (long *)0x6572656870736c61;
    local_220 = local_200[0];
    *(char *)((long)local_228 + (long)local_200[0]) = '\0';
    break;
  default:
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.h"
             ,0x56,"Unhandled wrap mode");
  }
  std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,(char *)local_228,(long)local_220);
  if (local_228 != local_218) {
    operator_delete(local_228,(ulong)((long)local_218[0] + 1));
  }
  _Var2._M_p = local_1e0._M_dataplus._M_p;
  std::__cxx11::stringbuf::str();
  plVar1 = local_200[0];
  iVar3 = snprintf((char *)0x0,0,_Var2._M_p,local_200[0]);
  local_220 = (long *)0x0;
  local_218[0] = (long *)((ulong)local_218[0] & 0xffffffffffffff00);
  local_228 = local_218;
  std::__cxx11::string::resize((ulong)&local_228,(char)(iVar3 + 1));
  snprintf((char *)local_228,(long)(iVar3 + 1),_Var2._M_p,plVar1);
  std::__cxx11::string::pop_back();
  std::__cxx11::string::_M_append((char *)s,(ulong)local_228);
  if (local_228 != local_218) {
    operator_delete(local_228,(long)local_218[0] + 1);
  }
  v_00 = local_208;
  if (local_200[0] != local_1f0) {
    operator_delete(local_200[0],local_1f0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
LAB_0033322b:
  stringPrintfRecursive<pbrt::ColorEncodingHandle_const&>(s,local_1c0,v_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}